

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O2

void tests_using_original_checksum_constant(void)

{
  decode_c1_minimalExample_isSuccessful();
  decode_c1_longExample_isSuccessful();
  encode_c1_minimalExample_isSuccessful();
  encode_c1_smallExample_isSuccessful();
  decode_and_encode_c1_minimalExample_producesSameResult();
  decode_and_encode_c1_smallExample_producesSameResult();
  decode_and_encode_c1_longExample_producesSameResult();
  return;
}

Assistant:

void tests_using_original_checksum_constant() {
    decode_c1_minimalExample_isSuccessful();
    decode_c1_longExample_isSuccessful();

    encode_c1_minimalExample_isSuccessful();
    encode_c1_smallExample_isSuccessful();

    decode_and_encode_c1_minimalExample_producesSameResult();
    decode_and_encode_c1_smallExample_producesSameResult();
    decode_and_encode_c1_longExample_producesSameResult();
}